

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_eviction_tests.cpp
# Opt level: O0

bool net_peer_eviction_tests::IsEvicted
               (int number_of_nodes,function<void_(NodeEvictionCandidate_&)> *candidate_setup_fn,
               unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
               *node_ids,FastRandomContext *random_context)

{
  bool bVar1;
  byte bVar2;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *in_RSI;
  undefined4 in_EDI;
  long in_FS_OFFSET;
  NodeEvictionCandidate *candidate;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *__range1;
  iterator __end1;
  iterator __begin1;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> candidates;
  __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
  *in_stack_ffffffffffffff58;
  NodeEvictionCandidate *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  FastRandomContext *in_stack_ffffffffffffff80;
  reference in_stack_ffffffffffffff88;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *candidates_00;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GetRandomNodeEvictionCandidates
            (in_stack_ffffffffffffffbc,
             (FastRandomContext *)CONCAT44(in_EDI,in_stack_ffffffffffffffb0));
  candidates_00 = &local_20;
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::begin
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             in_stack_ffffffffffffff60);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::end
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             in_stack_ffffffffffffff60);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
                      ((__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                       (__normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
                        *)in_stack_ffffffffffffff60);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffff88 =
         __gnu_cxx::
         __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
         ::operator*(in_stack_ffffffffffffff58);
    std::function<void_(NodeEvictionCandidate_&)>::operator()
              ((function<void_(NodeEvictionCandidate_&)> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60);
    __gnu_cxx::
    __normal_iterator<NodeEvictionCandidate_*,_std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>_>
    ::operator++(in_stack_ffffffffffffff58);
  }
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT44(in_EDI,in_stack_ffffffffffffffb0),in_RSI);
  bVar2 = IsEvicted(candidates_00,
                    (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                     *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::~vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffff68));
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::~vector
            ((vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *)
             CONCAT17(bVar2,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool IsEvicted(const int number_of_nodes, std::function<void(NodeEvictionCandidate&)> candidate_setup_fn, const std::unordered_set<NodeId>& node_ids, FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates = GetRandomNodeEvictionCandidates(number_of_nodes, random_context);
    for (NodeEvictionCandidate& candidate : candidates) {
        candidate_setup_fn(candidate);
    }
    return IsEvicted(candidates, node_ids, random_context);
}